

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

BOOL Js::JavascriptLibrary::CanFloatPreferenceFunc(BuiltinFunction index)

{
  bool bVar1;
  _E _Var2;
  BuiltinFunction local_d;
  BOOL local_c;
  BuiltinFunction index_local;
  
  local_d._value = index._value;
  bVar1 = BuiltinFunction::operator==(&local_d,None);
  if (bVar1) {
    local_c = 0;
  }
  else {
    _Var2 = BuiltinFunction::operator_cast_to__E(&local_d);
    switch(_Var2) {
    case Math_Abs:
    case Math_Acos:
    case Math_Asin:
    case Math_Atan:
    case Math_Cos:
    case Math_Exp:
    case Math_Log:
    case Math_Max:
    case Math_Min:
    case Math_Pow:
    case Math_Random:
    case Math_Sin:
    case Math_Sqrt:
    case Math_Tan:
    case Math_Fround:
      local_c = 1;
      break;
    default:
      local_c = 0;
    }
  }
  return local_c;
}

Assistant:

BOOL JavascriptLibrary::CanFloatPreferenceFunc(BuiltinFunction index)
    {
        // Shortcut the common case:
        if (index == BuiltinFunction::None)
        {
            return FALSE;
        }

        switch (index)
        {
        case BuiltinFunction::Math_Abs:
        case BuiltinFunction::Math_Acos:
        case BuiltinFunction::Math_Asin:
        case BuiltinFunction::Math_Atan:
        case BuiltinFunction::Math_Cos:
        case BuiltinFunction::Math_Exp:
        case BuiltinFunction::Math_Log:
        case BuiltinFunction::Math_Min:
        case BuiltinFunction::Math_Max:
        case BuiltinFunction::Math_Pow:
        case BuiltinFunction::Math_Random:
        case BuiltinFunction::Math_Sin:
        case BuiltinFunction::Math_Sqrt:
        case BuiltinFunction::Math_Tan:
        case BuiltinFunction::Math_Fround:
            return TRUE;
        }
        return FALSE;
    }